

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O1

void __thiscall RunPool<int>::AddFront(RunPool<int> *this,int *value)

{
  bool *pbVar1;
  int iVar2;
  RunBlock<int> *pRVar3;
  RunBlock<int> *pRVar4;
  
  pRVar4 = next_free_;
  if (this->begin_front_ == (RunBlock<int> *)0x0) {
    pRVar3 = next_free_ + 1;
    this->begin_front_ = next_free_;
    next_free_ = pRVar3;
    pRVar4->next_free_pos_ = 799;
    pRVar4->is_front = true;
    pRVar3 = this->begin_back_;
    pRVar4->next = pRVar3;
    this->end_front_ = pRVar4;
    pRVar3->prev = pRVar4;
  }
  pRVar3 = next_free_;
  pRVar4 = this->begin_front_;
  iVar2 = pRVar4->next_free_pos_;
  if (-1 < (long)iVar2) {
    pRVar4->values[iVar2] = *value;
    pRVar4->next_free_pos_ = iVar2 + -1;
    return;
  }
  pbVar1 = &next_free_->is_front;
  next_free_ = next_free_ + 1;
  *pbVar1 = true;
  pRVar3->next = pRVar4;
  pRVar3->values[799] = *value;
  pRVar3->next_free_pos_ = 0x31e;
  pRVar4->prev = pRVar3;
  this->begin_front_ = pRVar3;
  this->size_ = this->size_ + 800;
  return;
}

Assistant:

void AddFront(ValueType &value) {
        if(begin_front_ == NULL) {
            begin_front_ = Alloc();
            begin_front_->next_free_pos_ = kValuesPerBlock - 1;
            begin_front_->is_front = true;
            begin_front_->next = begin_back_;

            end_front_ = begin_front_;
            begin_back_->prev = end_front_;
        }

        if(begin_front_->next_free_pos_ < 0) {
            RunBlock<ValueType>* temp = Alloc();
            temp->is_front = true;
            temp->next = begin_front_;
            temp->values[kValuesPerBlock - 1] = value;
            temp->next_free_pos_ = kValuesPerBlock - 2;

            begin_front_->prev = temp;
            begin_front_ = temp;
            size_ += kValuesPerBlock;

        } else {
            begin_front_->values[begin_front_->next_free_pos_] = value;
            begin_front_->next_free_pos_--;
        }
    }